

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

bool cmakeCheckStampFile(string *stampName)

{
  bool bVar1;
  RenameResult RVar2;
  ostream *poVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string stampTemp;
  string err;
  string stampDepends;
  ostringstream stampTempStream;
  cmFileTimeCache ftc;
  ifstream fin;
  string local_630;
  string local_610;
  string local_5f0;
  string local_5d0;
  undefined1 local_5b0 [112];
  ios_base local_540 [264];
  undefined1 local_438 [8];
  char *local_430;
  __node_base local_428;
  pointer local_420;
  _Prime_rehash_policy local_418;
  __node_base_ptr local_408;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_400;
  ios_base local_340 [264];
  basic_string_view<char,_std::char_traits<char>_> local_238;
  undefined8 local_228;
  char *local_220;
  byte abStack_218 [488];
  
  local_238._M_str = (stampName->_M_dataplus)._M_p;
  local_238._M_len = stampName->_M_string_length;
  local_228 = 7;
  local_220 = ".depend";
  views._M_len = 2;
  views._M_array = &local_238;
  cmCatViews_abi_cxx11_(&local_5f0,views);
  std::ifstream::ifstream(&local_238,local_5f0._M_dataplus._M_p,_S_in);
  if ((abStack_218[*(long *)(local_238._M_len - 0x18)] & 5) == 0) {
    cmFileTimeCache::cmFileTimeCache((cmFileTimeCache *)local_438);
    local_5b0._0_8_ = local_5b0 + 0x10;
    local_5b0._8_8_ = 0;
    local_5b0[0x10] = '\0';
    do {
      do {
        bVar1 = cmsys::SystemTools::GetLineFromStream
                          ((istream *)&local_238,(string *)local_5b0,(bool *)0x0,0xffffffffffffffff)
        ;
        if (!bVar1) {
          if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
            operator_delete((void *)local_5b0._0_8_,CONCAT71(local_5b0._17_7_,local_5b0[0x10]) + 1);
          }
          cmFileTimeCache::~cmFileTimeCache((cmFileTimeCache *)local_438);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_5b0);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_5b0,(stampName->_M_dataplus)._M_p,
                              stampName->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,".tmp",4);
          cmSystemTools::RandomSeed();
          std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
          std::__cxx11::stringbuf::str();
          std::ofstream::ofstream
                    (local_438,
                     (char *)CONCAT44(local_630._M_dataplus._M_p._4_4_,
                                      (int)local_630._M_dataplus._M_p),_S_out);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_438,"# CMake generation timestamp file for this directory.\n",
                     0x36);
          local_438 = (undefined1  [8])_VTT;
          *(undefined8 *)(local_438 + (long)_VTT[-3]) = _EVP_PKEY_get_bn_param;
          std::filebuf::~filebuf((filebuf *)&local_430);
          std::ios_base::~ios_base(local_340);
          local_610._M_string_length = 0;
          local_610.field_2._M_local_buf[0] = '\0';
          local_610._M_dataplus._M_p = (pointer)&local_610.field_2;
          RVar2 = cmSystemTools::RenameFile(&local_630,stampName,Yes,&local_610);
          bVar1 = RVar2 == Success;
          if (!bVar1) {
            cmsys::SystemTools::RemoveFile(&local_630);
            local_420 = (stampName->_M_dataplus)._M_p;
            local_428._M_nxt = (_Hash_node_base *)stampName->_M_string_length;
            local_438 = (undefined1  [8])0x1a;
            local_430 = "Cannot restore timestamp \"";
            local_418._M_max_load_factor = 4.2039e-45;
            local_418._4_4_ = 0;
            local_418._M_next_resize = 0x6af1cf;
            local_408 = (__node_base_ptr)local_610._M_string_length;
            local_400 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_610._M_dataplus._M_p;
            views_00._M_len = 4;
            views_00._M_array = (iterator)local_438;
            cmCatViews_abi_cxx11_(&local_5d0,views_00);
            cmSystemTools::Error(&local_5d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
              operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_610._M_dataplus._M_p != &local_610.field_2) {
            operator_delete(local_610._M_dataplus._M_p,
                            CONCAT71(local_610.field_2._M_allocated_capacity._1_7_,
                                     local_610.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_630._M_dataplus._M_p._4_4_,(int)local_630._M_dataplus._M_p) !=
              &local_630.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_630._M_dataplus._M_p._4_4_,
                                     (int)local_630._M_dataplus._M_p),
                            local_630.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_5b0);
          std::ios_base::~ios_base(local_540);
          goto LAB_002258ea;
        }
      } while ((local_5b0._8_8_ == 0) || (*(char *)local_5b0._0_8_ == '#'));
      bVar1 = cmFileTimeCache::Compare
                        ((cmFileTimeCache *)local_438,&local_5f0,(string *)local_5b0,
                         (int *)&local_630);
    } while (bVar1 && -1 < (int)local_630._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"CMake is re-running because ",0x1c);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(stampName->_M_dataplus)._M_p,
                        stampName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," is out-of-date.\n",0x11);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  the file \'",0xc);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_5b0._0_8_,local_5b0._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"  is newer than \'",0x11);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_5f0._M_dataplus._M_p,local_5f0._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  result=\'",10);
    poVar3 = (ostream *)std::ostream::operator<<(&std::cout,(int)local_630._M_dataplus._M_p);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\'\n",2);
    if ((undefined1 *)local_5b0._0_8_ != local_5b0 + 0x10) {
      operator_delete((void *)local_5b0._0_8_,CONCAT71(local_5b0._17_7_,local_5b0[0x10]) + 1);
    }
    cmFileTimeCache::~cmFileTimeCache((cmFileTimeCache *)local_438);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"CMake is re-running because ",0x1c);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(stampName->_M_dataplus)._M_p,
                        stampName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," dependency file is missing.\n",0x1d)
    ;
  }
  bVar1 = false;
LAB_002258ea:
  std::ifstream::~ifstream(&local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,local_5f0.field_2._M_allocated_capacity + 1);
  }
  return bVar1;
}

Assistant:

static bool cmakeCheckStampFile(const std::string& stampName)
{
  // The stamp file does not exist.  Use the stamp dependencies to
  // determine whether it is really out of date.  This works in
  // conjunction with cmLocalVisualStudio7Generator to avoid
  // repeatedly re-running CMake when the user rebuilds the entire
  // solution.
  std::string stampDepends = cmStrCat(stampName, ".depend");
#if defined(_WIN32) || defined(__CYGWIN__)
  cmsys::ifstream fin(stampDepends.c_str(), std::ios::in | std::ios::binary);
#else
  cmsys::ifstream fin(stampDepends.c_str());
#endif
  if (!fin) {
    // The stamp dependencies file cannot be read.  Just assume the
    // build system is really out of date.
    std::cout << "CMake is re-running because " << stampName
              << " dependency file is missing.\n";
    return false;
  }

  // Compare the stamp dependencies against the dependency file itself.
  {
    cmFileTimeCache ftc;
    std::string dep;
    while (cmSystemTools::GetLineFromStream(fin, dep)) {
      int result;
      if (!dep.empty() && dep[0] != '#' &&
          (!ftc.Compare(stampDepends, dep, &result) || result < 0)) {
        // The stamp depends file is older than this dependency.  The
        // build system is really out of date.
        std::cout << "CMake is re-running because " << stampName
                  << " is out-of-date.\n";
        std::cout << "  the file '" << dep << "'\n";
        std::cout << "  is newer than '" << stampDepends << "'\n";
        std::cout << "  result='" << result << "'\n";
        return false;
      }
    }
  }

  // The build system is up to date.  The stamp file has been removed
  // by the VS IDE due to a "rebuild" request.  Restore it atomically.
  std::ostringstream stampTempStream;
  stampTempStream << stampName << ".tmp" << cmSystemTools::RandomSeed();
  std::string stampTemp = stampTempStream.str();
  {
    // TODO: Teach cmGeneratedFileStream to use a random temp file (with
    // multiple tries in unlikely case of conflict) and use that here.
    cmsys::ofstream stamp(stampTemp.c_str());
    stamp << "# CMake generation timestamp file for this directory.\n";
  }
  std::string err;
  if (cmSystemTools::RenameFile(stampTemp, stampName,
                                cmSystemTools::Replace::Yes, &err) ==
      cmSystemTools::RenameResult::Success) {
    // CMake does not need to re-run because the stamp file is up-to-date.
    return true;
  }
  cmSystemTools::RemoveFile(stampTemp);
  cmSystemTools::Error(
    cmStrCat("Cannot restore timestamp \"", stampName, "\": ", err));
  return false;
}